

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,int *active,char *str,int len,
                nk_toggle_type type,nk_style_toggle *style,nk_input *in,nk_user_font *font)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  nk_rect select_00;
  int iVar5;
  float local_a0;
  float local_9c;
  float local_98;
  undefined1 local_94 [8];
  nk_rect label;
  nk_rect cursor;
  nk_rect select;
  nk_rect bounds;
  int was_active;
  nk_toggle_type type_local;
  int len_local;
  char *str_local;
  int *active_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_20;
  nk_rect r_local;
  
  if (style == (nk_style_toggle *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f13,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f14,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f15,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if ((((out == (nk_command_buffer *)0x0) || (style == (nk_style_toggle *)0x0)) ||
      (font == (nk_user_font *)0x0)) || (active == (int *)0x0)) {
    r_local.w = 0.0;
  }
  else {
    r_local.x = r.w;
    fVar1 = (style->padding).x;
    if (fVar1 + fVar1 + font->height <= r_local.x) {
      local_98 = r_local.x;
    }
    else {
      fVar1 = (style->padding).x;
      local_98 = fVar1 + fVar1 + font->height;
    }
    r_local.y = r.h;
    fVar1 = (style->padding).y;
    if (fVar1 + fVar1 + font->height <= r_local.y) {
      local_9c = r_local.y;
    }
    else {
      fVar1 = (style->padding).y;
      local_9c = fVar1 + fVar1 + font->height;
    }
    state_local._4_4_ = r.x;
    fStack_20 = r.y;
    fVar1 = (style->touch_padding).x;
    fVar2 = (style->touch_padding).y;
    label.y = font->height;
    local_94._4_4_ = (fStack_20 + local_9c / 2.0) - label.y / 2.0;
    cursor.w = state_local._4_4_;
    label.w = state_local._4_4_ + (style->padding).x + style->border;
    label.h = (float)local_94._4_4_ + (style->padding).y + style->border;
    fVar3 = (style->padding).x;
    cursor.x = label.y - (fVar3 + fVar3 + style->border * 2.0);
    fVar3 = (style->padding).y;
    cursor.y = label.y - (fVar3 + fVar3 + style->border * 2.0);
    local_94._0_4_ = state_local._4_4_ + label.y + style->spacing;
    local_a0 = (float)local_94._0_4_;
    if ((float)local_94._0_4_ <= state_local._4_4_ + local_98) {
      local_a0 = state_local._4_4_ + local_98;
    }
    label.x = local_a0 - (float)local_94._0_4_;
    iVar4 = *active;
    select_00.y = fStack_20 - (style->touch_padding).y;
    select_00.x = state_local._4_4_ - (style->touch_padding).x;
    select_00.w = fVar1 + fVar1 + local_98;
    select_00.h = fVar2 + fVar2 + local_9c;
    cursor.h = (float)local_94._4_4_;
    iVar5 = nk_toggle_behavior(in,select_00,state,*active);
    *active = iVar5;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    if (type == NK_TOGGLE_CHECK) {
      nk_draw_checkbox(out,*state,style,*active,(nk_rect *)local_94,(nk_rect *)&cursor.w,
                       (nk_rect *)&label.w,str,len,font);
    }
    else {
      nk_draw_option(out,*state,style,*active,(nk_rect *)local_94,(nk_rect *)&cursor.w,
                     (nk_rect *)&label.w,str,len,font);
    }
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
    r_local.w = (float)(uint)(iVar4 != *active);
  }
  return (int)r_local.w;
}

Assistant:

NK_LIB int
nk_do_toggle(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect r,
    int *active, const char *str, int len, enum nk_toggle_type type,
    const struct nk_style_toggle *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int was_active;
    struct nk_rect bounds;
    struct nk_rect select;
    struct nk_rect cursor;
    struct nk_rect label;

    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(font);
    if (!out || !style || !font || !active)
        return 0;

    r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
    r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

    /* add additional touch padding for touch screen devices */
    bounds.x = r.x - style->touch_padding.x;
    bounds.y = r.y - style->touch_padding.y;
    bounds.w = r.w + 2 * style->touch_padding.x;
    bounds.h = r.h + 2 * style->touch_padding.y;

    /* calculate the selector space */
    select.w = font->height;
    select.h = select.w;
    select.y = r.y + r.h/2.0f - select.h/2.0f;
    select.x = r.x;

    /* calculate the bounds of the cursor inside the selector */
    cursor.x = select.x + style->padding.x + style->border;
    cursor.y = select.y + style->padding.y + style->border;
    cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
    cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

    /* label behind the selector */
    label.x = select.x + select.w + style->spacing;
    label.y = select.y;
    label.w = NK_MAX(r.x + r.w, label.x) - label.x;
    label.h = select.w;

    /* update selector */
    was_active = *active;
    *active = nk_toggle_behavior(in, bounds, state, *active);

    /* draw selector */
    if (style->draw_begin)
        style->draw_begin(out, style->userdata);
    if (type == NK_TOGGLE_CHECK) {
        nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    } else {
        nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    }
    if (style->draw_end)
        style->draw_end(out, style->userdata);
    return (was_active != *active);
}